

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.hpp
# Opt level: O0

void __thiscall
diy::stats::ScopedProfile<diy::stats::Profiler>::ScopedProfile
          (ScopedProfile<diy::stats::Profiler> *this,Profiler *prof_,string *name_)

{
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  Profiler *in_stack_ffffffffffffffe0;
  
  *in_RDI = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  *(undefined1 *)(in_RDI + 5) = 1;
  std::__cxx11::string::string(local_38,(string *)(in_RDI + 1));
  Profiler::operator<<(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

ScopedProfile(Profiler& prof_, std::string name_):
            prof(prof_), name(name_), active(true)  { prof << name; }